

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

Vec_Ptr_t * Nwk_ManDfsReverse(Nwk_Man_t *pNtk)

{
  Tim_Man_t *p;
  int iVar1;
  Vec_Ptr_t *p_00;
  Nwk_Obj_t *pObj;
  long *Entry;
  int iVar2;
  
  Nwk_ManIncrementTravId(pNtk);
  p_00 = Vec_PtrAlloc(100);
  iVar2 = 0;
  do {
    if (pNtk->vCis->nSize <= iVar2) {
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        Entry = (long *)Vec_PtrEntry(pNtk->vObjs,iVar2);
        if ((((Entry != (long *)0x0) && ((*(uint *)(Entry + 4) & 7) == 3)) &&
            (*(int *)((long)Entry + 0x3c) == 0)) && ((int)Entry[5] != *(int *)(*Entry + 0x68))) {
          Vec_PtrPush(p_00,Entry);
        }
      }
      return p_00;
    }
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCis,iVar2);
    if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
      p = pObj->pMan->pManTime;
      if (p != (Tim_Man_t *)0x0) {
        iVar1 = Tim_ManBoxForCi(p,*(uint *)&pObj->field_0x20 >> 7);
        if (iVar1 != -1) goto LAB_00714ba6;
      }
      Nwk_ManDfsReverse_rec(pObj,p_00);
    }
LAB_00714ba6:
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Nwk_ManDfsReverse( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i;
    Nwk_ManIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ManForEachPi( pNtk, pObj, i )
        Nwk_ManDfsReverse_rec( pObj, vNodes );
    // add nodes without fanins
    Nwk_ManForEachNode( pNtk, pObj, i )
        if ( Nwk_ObjFaninNum(pObj) == 0 && !Nwk_ObjIsTravIdCurrent(pObj) )
            Vec_PtrPush( vNodes, pObj );
    return vNodes;
}